

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O2

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::RemoveDeviceData
          (ArchiverFactoryImpl *this,IDataBlob *pSrcArchive,ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
          IDataBlob **ppDstArchive)

{
  IDataBlob *pIVar1;
  DeviceType Dev;
  string msg;
  CreateInfo local_120;
  DeviceObjectArchive local_110;
  
  if (pSrcArchive == (IDataBlob *)0x0) {
    FormatString<char[29]>((string *)&local_110,(char (*) [29])"pSrcArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_110.m_NamedResources._M_h._M_buckets,"RemoveDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0xdc);
  }
  else {
    if (ppDstArchive != (IDataBlob **)0x0) {
      if (*ppDstArchive != (IDataBlob *)0x0) {
        FormatString<char[27]>((string *)&local_110,(char (*) [27])"*ppDstArchive must be null");
        DebugAssertionFailed
                  ((Char *)local_110.m_NamedResources._M_h._M_buckets,"RemoveDeviceData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                   ,0xe4);
        std::__cxx11::string::~string((string *)&local_110);
      }
      local_120.ContentVersion = 0xffffffff;
      local_120.MakeCopy = false;
      local_120.pData = pSrcArchive;
      DeviceObjectArchive::DeviceObjectArchive(&local_110,&local_120);
      for (; DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE;
          DeviceFlags = DeviceFlags ^ -DeviceFlags & DeviceFlags) {
        Dev = ArchiveDeviceDataFlagToArchiveDeviceType(-DeviceFlags & DeviceFlags);
        DeviceObjectArchive::RemoveDeviceData(&local_110,Dev);
      }
      DeviceObjectArchive::Serialize(&local_110,ppDstArchive);
      pIVar1 = *ppDstArchive;
      DeviceObjectArchive::~DeviceObjectArchive(&local_110);
      return pIVar1 != (IDataBlob *)0x0;
    }
    FormatString<char[30]>((string *)&local_110,(char (*) [30])"ppDstArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_110.m_NamedResources._M_h._M_buckets,"RemoveDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0xe1);
  }
  std::__cxx11::string::~string((string *)&local_110);
  return false;
}

Assistant:

Bool ArchiverFactoryImpl::RemoveDeviceData(const IDataBlob*          pSrcArchive,
                                           ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
                                           IDataBlob**               ppDstArchive) const
{
    if (pSrcArchive == nullptr)
    {
        DEV_ERROR("pSrcArchive must not be null");
        return false;
    }
    if (ppDstArchive == nullptr)
    {
        DEV_ERROR("ppDstArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppDstArchive == nullptr, "*ppDstArchive must be null");

    try
    {
        DeviceObjectArchive ObjectArchive{DeviceObjectArchive::CreateInfo{pSrcArchive}};

        while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
        {
            const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
            const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

            ObjectArchive.RemoveDeviceData(ArchiveDeviceType);
        }

        ObjectArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}